

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O3

void __thiscall Map::removeRegionOwner(Map *this,Player *player)

{
  pointer ppVar1;
  uint uVar2;
  Player *this_00;
  pointer ppVar3;
  string local_40;
  
  this_00 = (Player *)operator_new(0x250);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  Player::Player(this_00,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  uVar2 = Player::getZone(player);
  if (uVar2 - 1 < 6) {
    ppVar3 = (this->regionOwners).
             super__Vector_base<std::pair<Player_*,_Player_*>,_std::allocator<std::pair<Player_*,_Player_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar2;
  }
  else {
    if ((int)uVar2 < 7) {
      return;
    }
    ppVar1 = (this->regionOwners).
             super__Vector_base<std::pair<Player_*,_Player_*>,_std::allocator<std::pair<Player_*,_Player_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar3 = ppVar1 + uVar2;
    if (ppVar1[uVar2].first != player) {
      if (ppVar3->second != player) {
        return;
      }
      ppVar3 = (pointer)&ppVar3->second;
    }
  }
  ppVar3->first = this_00;
  return;
}

Assistant:

void Map::removeRegionOwner(Player* player) {
    Player* emptyPlayer = new Player("");
    int currentRegion = player->getZone();

    if(currentRegion >0 && currentRegion <7) { // Manhattan
        regionOwners[currentRegion].first = emptyPlayer;
    }
    else if (currentRegion > 6) { // Rest of NY
        if(regionOwners[currentRegion].first == player){ // in first spot
            regionOwners[currentRegion].first = emptyPlayer;
        }
        else if (regionOwners[currentRegion].second == player) { // in second spot
            regionOwners[currentRegion].second = emptyPlayer;
        }
    }
}